

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_crypto_three_reg_sha(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t val;
  uint32_t regno;
  uint32_t regno_00;
  uint32_t regno_01;
  TCGv_ptr arg1;
  TCGv_ptr arg2;
  TCGv_ptr arg3;
  TCGv_i32 arg4;
  TCGv_i32 tcg_opcode;
  _Bool feature;
  TCGv_ptr tcg_rm_ptr;
  TCGv_ptr tcg_rn_ptr;
  TCGv_ptr tcg_rd_ptr;
  CryptoThreeOpFn *genfn;
  int rd;
  int rn;
  int rm;
  int opcode;
  int size;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar2 = extract32(insn,0x16,2);
  val = extract32(insn,0xc,3);
  regno = extract32(insn,0x10,5);
  regno_00 = extract32(insn,5,5);
  regno_01 = extract32(insn,0,5);
  if (uVar2 == 0) {
    switch(val) {
    case 0:
    case 1:
    case 2:
    case 3:
      tcg_rd_ptr = (TCGv_ptr)0x0;
      tcg_opcode._7_1_ = isar_feature_aa64_sha1(s->isar);
      break;
    case 4:
      tcg_rd_ptr = (TCGv_ptr)gen_helper_crypto_sha256h;
      tcg_opcode._7_1_ = isar_feature_aa64_sha256(s->isar);
      break;
    case 5:
      tcg_rd_ptr = (TCGv_ptr)gen_helper_crypto_sha256h2;
      tcg_opcode._7_1_ = isar_feature_aa64_sha256(s->isar);
      break;
    case 6:
      tcg_rd_ptr = (TCGv_ptr)gen_helper_crypto_sha256su1;
      tcg_opcode._7_1_ = isar_feature_aa64_sha256(s->isar);
      break;
    default:
      unallocated_encoding_aarch64(s);
      return;
    }
    if (tcg_opcode._7_1_ == false) {
      unallocated_encoding_aarch64(s);
    }
    else {
      _Var1 = fp_access_check(s);
      if (_Var1) {
        arg1 = vec_full_reg_ptr(s,regno_01);
        arg2 = vec_full_reg_ptr(s,regno_00);
        arg3 = vec_full_reg_ptr(s,regno);
        if (tcg_rd_ptr == (TCGv_ptr)0x0) {
          arg4 = tcg_const_i32_aarch64(tcg_ctx_00,val);
          gen_helper_crypto_sha1_3reg(tcg_ctx_00,arg1,arg2,arg3,arg4);
          tcg_temp_free_i32(tcg_ctx_00,arg4);
        }
        else {
          (*(code *)tcg_rd_ptr)(tcg_ctx_00,arg1,arg2,arg3);
        }
        tcg_temp_free_ptr(tcg_ctx_00,arg1);
        tcg_temp_free_ptr(tcg_ctx_00,arg2);
        tcg_temp_free_ptr(tcg_ctx_00,arg3);
      }
    }
  }
  else {
    unallocated_encoding_aarch64(s);
  }
  return;
}

Assistant:

static void disas_crypto_three_reg_sha(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int size = extract32(insn, 22, 2);
    int opcode = extract32(insn, 12, 3);
    int rm = extract32(insn, 16, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    CryptoThreeOpFn *genfn;
    TCGv_ptr tcg_rd_ptr, tcg_rn_ptr, tcg_rm_ptr;
    bool feature;

    if (size != 0) {
        unallocated_encoding(s);
        return;
    }

    switch (opcode) {
    case 0: /* SHA1C */
    case 1: /* SHA1P */
    case 2: /* SHA1M */
    case 3: /* SHA1SU0 */
        genfn = NULL;
        feature = dc_isar_feature(aa64_sha1, s);
        break;
    case 4: /* SHA256H */
        genfn = gen_helper_crypto_sha256h;
        feature = dc_isar_feature(aa64_sha256, s);
        break;
    case 5: /* SHA256H2 */
        genfn = gen_helper_crypto_sha256h2;
        feature = dc_isar_feature(aa64_sha256, s);
        break;
    case 6: /* SHA256SU1 */
        genfn = gen_helper_crypto_sha256su1;
        feature = dc_isar_feature(aa64_sha256, s);
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!feature) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_rd_ptr = vec_full_reg_ptr(s, rd);
    tcg_rn_ptr = vec_full_reg_ptr(s, rn);
    tcg_rm_ptr = vec_full_reg_ptr(s, rm);

    if (genfn) {
        genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr, tcg_rm_ptr);
    } else {
        TCGv_i32 tcg_opcode = tcg_const_i32(tcg_ctx, opcode);

        gen_helper_crypto_sha1_3reg(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr,
                                    tcg_rm_ptr, tcg_opcode);
        tcg_temp_free_i32(tcg_ctx, tcg_opcode);
    }

    tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
    tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
    tcg_temp_free_ptr(tcg_ctx, tcg_rm_ptr);
}